

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesFrequencyOcGetVoltageTarget
          (zes_freq_handle_t hFrequency,double *pCurrentVoltageTarget,double *pCurrentVoltageOffset)

{
  zes_pfnFrequencyOcGetVoltageTarget_t pfnOcGetVoltageTarget;
  dditable_t *dditable;
  ze_result_t result;
  double *pCurrentVoltageOffset_local;
  double *pCurrentVoltageTarget_local;
  zes_freq_handle_t hFrequency_local;
  
  if (*(code **)(*(long *)(hFrequency + 8) + 0xb20) == (code *)0x0) {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFrequency_local._4_4_ =
         (**(code **)(*(long *)(hFrequency + 8) + 0xb20))
                   (*(undefined8 *)hFrequency,pCurrentVoltageTarget,pCurrentVoltageOffset);
  }
  return hFrequency_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcGetVoltageTarget(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        double* pCurrentVoltageTarget,                  ///< [out] Overclock voltage in Volts. This cannot be greater than the
                                                        ///< `maxOcVoltage` member of ::zes_oc_capabilities_t.
        double* pCurrentVoltageOffset                   ///< [out] This voltage offset is applied to all points on the
                                                        ///< voltage/frequency curve, including the new overclock voltageTarget.
                                                        ///< Valid range is between the `minOcVoltageOffset` and
                                                        ///< `maxOcVoltageOffset` members of ::zes_oc_capabilities_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_freq_object_t*>( hFrequency )->dditable;
        auto pfnOcGetVoltageTarget = dditable->zes.Frequency.pfnOcGetVoltageTarget;
        if( nullptr == pfnOcGetVoltageTarget )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFrequency = reinterpret_cast<zes_freq_object_t*>( hFrequency )->handle;

        // forward to device-driver
        result = pfnOcGetVoltageTarget( hFrequency, pCurrentVoltageTarget, pCurrentVoltageOffset );

        return result;
    }